

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::Capturer::Capturer
          (Capturer *this,StringRef *macroName,SourceLineInfo *lineInfo,OfType resultType,
          StringRef *names)

{
  ulong uVar1;
  int iVar2;
  IResultCapture *pIVar3;
  char *pcVar4;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  char c;
  byte local_c9;
  Capturer *local_c8;
  OfType local_bc;
  StringRef *local_b8;
  SourceLineInfo *local_b0;
  _Deque_base<char,_std::allocator<char>_> local_a8;
  char *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  (this->m_messages).super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_messages).super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_messages).super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_bc = resultType;
  local_b8 = macroName;
  local_b0 = lineInfo;
  pIVar3 = getResultCapture();
  this->m_resultCapture = pIVar3;
  this->m_captured = 0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_map_size = 0;
  clara::std::_Deque_base<char,_std::allocator<char>_>::_M_initialize_map(&local_a8,0);
  if (names->m_size == 0) {
    uVar8 = 0;
  }
  else {
    lVar9 = 1;
    uVar5 = 0;
    uVar8 = 0;
    local_c8 = this;
    do {
      local_c9 = names->m_start[uVar5];
      uVar1 = uVar8;
      if (local_c9 < 0x5b) {
        if (local_c9 != 0x28) {
          if (local_c9 != 0x29) {
            if (((local_c9 == 0x2c) && (uVar1 = uVar5, uVar8 != uVar5)) &&
               (uVar1 = uVar8,
               local_a8._M_impl.super__Deque_impl_data._M_start._M_last +
               (long)(local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur +
                     (((((ulong)((long)local_a8._M_impl.super__Deque_impl_data._M_finish._M_node -
                                (long)local_a8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3
                        ) - 1) +
                      (ulong)(local_a8._M_impl.super__Deque_impl_data._M_finish._M_node ==
                             (_Map_pointer)0x0)) * 0x200 -
                     (long)local_a8._M_impl.super__Deque_impl_data._M_finish._M_first)) ==
               local_a8._M_impl.super__Deque_impl_data._M_start._M_cur)) {
              std::vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>>::
              emplace_back<Catch::StringRef&,Catch::SourceLineInfo_const&,Catch::ResultWas::OfType&>
                        ((vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>> *)this,
                         local_b8,local_b0,&local_bc);
              pcVar4 = names->m_start;
              lVar7 = lVar9 - uVar8;
              while ((pcVar4[uVar8] == 0x2c || (iVar2 = isspace((int)pcVar4[uVar8]), iVar2 != 0))) {
                uVar8 = uVar8 + 1;
                lVar7 = lVar7 + -1;
              }
              local_58 = pcVar4 + uVar8;
              pcVar4 = pcVar4 + uVar5;
              while ((*pcVar4 == 0x2c || (iVar2 = isspace((int)*pcVar4), iVar2 != 0))) {
                lVar7 = lVar7 + -1;
                pcVar4 = pcVar4 + -1;
              }
              pcVar4 = local_58;
              if (names->m_size <= uVar8) {
                lVar7 = 0;
                pcVar4 = "";
              }
              local_50[0] = local_40;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_50,pcVar4,pcVar4 + lVar7);
              this = local_c8;
              std::__cxx11::string::operator=
                        ((string *)
                         &(local_c8->m_messages).
                          super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-1].message,(string *)local_50)
              ;
              if (local_50[0] != local_40) {
                operator_delete(local_50[0]);
              }
              std::__cxx11::string::append
                        ((char *)&(this->m_messages).
                                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_finish[-1].message);
              uVar1 = uVar5;
            }
            goto LAB_001205be;
          }
          goto LAB_00120560;
        }
LAB_00120542:
        if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_a8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<char,std::allocator<char>>::_M_push_back_aux<char_const&>
                    ((deque<char,std::allocator<char>> *)&local_a8,(char *)&local_c9);
        }
        else {
          *local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_c9;
          local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
      }
      else {
        if (local_c9 < 0x7b) {
          if (local_c9 == 0x5b) goto LAB_00120542;
          if (local_c9 != 0x5d) goto LAB_001205be;
        }
        else if (local_c9 != 0x7d) {
          if (local_c9 == 0x7b) goto LAB_00120542;
          goto LAB_001205be;
        }
LAB_00120560:
        if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_a8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          operator_delete(local_a8._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_a8._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_a8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_a8._M_impl.super__Deque_impl_data._M_finish._M_last =
               (_Elt_pointer)
               ((byte *)local_a8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x200);
          local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               (_Elt_pointer)
               ((byte *)local_a8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1ff);
          local_a8._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_a8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
      }
LAB_001205be:
      uVar8 = uVar1;
      uVar5 = uVar5 + 1;
      lVar9 = lVar9 + 1;
    } while (uVar5 < names->m_size);
  }
  std::vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>>::
  emplace_back<Catch::StringRef&,Catch::SourceLineInfo_const&,Catch::ResultWas::OfType&>
            ((vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>> *)this,local_b8,local_b0
             ,&local_bc);
  pcVar4 = names->m_start;
  uVar5 = names->m_size;
  while ((pcVar4[uVar8] == 0x2c || (iVar2 = isspace((int)pcVar4[uVar8]), iVar2 != 0))) {
    uVar8 = uVar8 + 1;
  }
  pcVar6 = pcVar4 + uVar5;
  lVar9 = uVar5 - uVar8;
  while( true ) {
    pcVar6 = pcVar6 + -1;
    if ((*pcVar6 != 0x2c) && (iVar2 = isspace((int)*pcVar6), iVar2 == 0)) break;
    lVar9 = lVar9 + -1;
  }
  lVar7 = 0;
  if (uVar8 < uVar5) {
    lVar7 = lVar9;
  }
  pcVar6 = "";
  if (uVar8 < uVar5) {
    pcVar6 = pcVar4 + uVar8;
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,pcVar6,pcVar6 + lVar7);
  std::__cxx11::string::operator=
            ((string *)
             &(this->m_messages).
              super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
              super__Vector_impl_data._M_finish[-1].message,(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  std::__cxx11::string::append
            ((char *)&(this->m_messages).
                      super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].message);
  clara::std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base(&local_a8);
  return;
}

Assistant:

Capturer::Capturer( StringRef macroName, SourceLineInfo const& lineInfo, ResultWas::OfType resultType, StringRef names ) {
        auto trimmed = [&] (size_t start, size_t end) {
            while (names[start] == ',' || isspace(names[start])) {
                ++start;
            }
            while (names[end] == ',' || isspace(names[end])) {
                --end;
            }
            return names.substr(start, end - start + 1);
        };

        size_t start = 0;
        std::stack<char> openings;
        for (size_t pos = 0; pos < names.size(); ++pos) {
            char c = names[pos];
            switch (c) {
            case '[':
            case '{':
            case '(':
            // It is basically impossible to disambiguate between
            // comparison and start of template args in this context
//            case '<':
                openings.push(c);
                break;
            case ']':
            case '}':
            case ')':
//           case '>':
                openings.pop();
                break;
            case ',':
                if (start != pos && openings.size() == 0) {
                    m_messages.emplace_back(macroName, lineInfo, resultType);
                    m_messages.back().message = trimmed(start, pos);
                    m_messages.back().message += " := ";
                    start = pos;
                }
            }
        }
        assert(openings.size() == 0 && "Mismatched openings");
        m_messages.emplace_back(macroName, lineInfo, resultType);
        m_messages.back().message = trimmed(start, names.size() - 1);
        m_messages.back().message += " := ";
    }